

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O3

Name __thiscall
wasm::JSPI::makeWrapperForExport(JSPI *this,Function *func,Module *module,Name suspender)

{
  size_t *psVar1;
  pointer *ppNVar2;
  pointer pNVar3;
  char *pcVar4;
  uintptr_t uVar5;
  Module *this_00;
  undefined1 auVar6 [8];
  pointer pTVar7;
  long *plVar8;
  Const *pCVar9;
  pointer puVar10;
  Type *pTVar11;
  Block *this_01;
  Expression *pEVar12;
  GlobalSet *this_02;
  Function *pFVar13;
  undefined1 reuse;
  pointer pCVar14;
  Builder BVar15;
  Type TVar16;
  pointer pNVar17;
  Index index;
  MixedArena *this_03;
  ExpressionList *this_04;
  string_view sVar18;
  Signature SVar19;
  optional<wasm::Type> type_;
  Name name;
  undefined1 local_130 [80];
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *local_e0;
  Const *local_d8;
  Module *local_d0;
  Function *local_c8;
  HeapType *local_c0;
  string_view local_b8;
  pointer *ppNStack_a8;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> namedWrapperParams;
  Builder local_80;
  Builder builder;
  Iterator __begin2;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> wrapperParams;
  
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
       (Type *)builder.wasm;
  local_130._48_8_ = suspender.super_IString.str._M_str;
  ppNVar2 = &namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppNStack_a8 = ppNVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ppNStack_a8,"export$","");
  pcVar4 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
  psVar1 = &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  local_c8 = func;
  builder.wasm = (Module *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&builder,pcVar4,
             pcVar4 + (func->super_Importable).super_Named.name.super_IString.str._M_len);
  pNVar3 = (pointer)((long)&((namedWrapperParams.
                              super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                              _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str.
                            _M_len +
                    (long)&(__begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id);
  pNVar17 = (pointer)0xf;
  if (ppNStack_a8 != ppNVar2) {
    pNVar17 = namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pNVar17 < pNVar3) {
    pNVar17 = (pointer)0xf;
    if (builder.wasm != (Module *)psVar1) {
      pNVar17 = (pointer)__begin2.
                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    }
    if (pNVar3 <= pNVar17) {
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&builder,0,(char *)0x0,(ulong)ppNStack_a8);
      goto LAB_00918411;
    }
  }
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&ppNStack_a8,(ulong)builder.wasm);
LAB_00918411:
  auStack_58 = (undefined1  [8])
               &wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish;
  pCVar14 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pCVar14) {
    wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(pCVar14->name)._M_dataplus._M_p;
    wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)plVar8[3];
  }
  else {
    wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(pCVar14->name)._M_dataplus._M_p;
    auStack_58 = (undefined1  [8])*plVar8;
  }
  wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)plVar8[1];
  *plVar8 = (long)pCVar14;
  plVar8[1] = 0;
  *(undefined1 *)&(pCVar14->name)._M_dataplus._M_p = 0;
  sVar18._M_str = (char *)0x0;
  sVar18._M_len = (size_t)auStack_58;
  sVar18 = IString::interned((IString *)
                             wrapperParams.
                             super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                             super__Vector_impl_data._M_start,sVar18,SUB81(pCVar14,0));
  reuse = SUB81(pCVar14,0);
  join_0x00000010_0x00000000_ = (string_view)Names::getValidFunctionName(module,(Name)sVar18);
  if (auStack_58 !=
      (undefined1  [8])
      &wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_58,
                    (ulong)((long)&(wrapperParams.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->id + 1));
  }
  if (builder.wasm != (Module *)psVar1) {
    operator_delete(builder.wasm,
                    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index + 1);
  }
  pFVar13 = local_c8;
  local_130._56_8_ = suspender.super_IString.str._M_len;
  if (ppNStack_a8 != ppNVar2) {
    operator_delete(ppNStack_a8,
                    (ulong)((long)&((namedWrapperParams.
                                     super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->name).
                                   super_IString.str._M_len + 1));
  }
  local_80.wasm = module;
  pCVar9 = (Const *)MixedArena::allocSpace(&module->allocator,0x48,8);
  (pCVar9->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id = CallId;
  (pCVar9->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 0;
  (pCVar9->value).field_0.i64 = 0;
  (pCVar9->value).field_0.func.super_IString.str._M_str = (char *)0x0;
  (pCVar9->value).type.id = 0;
  *(MixedArena **)&pCVar9[1].super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression =
       &module->allocator;
  pCVar9[1].super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
  pCVar9[1].value.field_0.i64 = 0;
  pCVar9[1].value.field_0.v128[8] = '\0';
  pcVar4 = (pFVar13->super_Importable).super_Named.name.super_IString.str._M_str;
  pCVar9[1].super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id =
       (pFVar13->super_Importable).super_Named.name.super_IString.str._M_len;
  pCVar9[1].value.field_0.i64 = (int64_t)pcVar4;
  local_c0 = &pFVar13->type;
  SVar19 = HeapType::getSignature(local_c0);
  (pCVar9->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id =
       SVar19.results.id.id;
  wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppNStack_a8 = (pointer *)0x0;
  namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar11 = &this->externref;
  std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
            ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_58,(iterator)0x0,pTVar11);
  sVar18 = IString::interned((IString *)0x4,(string_view)ZEXT816(0xde8022),(bool)reuse);
  _builder = (string_view)Names::getValidLocalName(pFVar13,(Name)sVar18);
  std::vector<wasm::NameType,std::allocator<wasm::NameType>>::emplace_back<wasm::Name,wasm::Type&>
            ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)&ppNStack_a8,(Name *)&builder,
             pTVar11);
  SVar19 = HeapType::getSignature(local_c0);
  local_130._0_8_ = SVar19.params.id;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  builder.wasm = (Module *)local_130;
  puVar10 = (pointer)wasm::Type::size((Type *)local_130);
  local_130._64_8_ = pTVar11;
  local_d8 = pCVar9;
  local_d0 = module;
  if (((pointer)__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
       != puVar10) || (BVar15.wasm = local_80.wasm, builder.wasm != (Module *)local_130)) {
    local_130._32_8_ = &pCVar9->value;
    index = 0;
    local_130._40_8_ = puVar10;
    do {
      pTVar11 = wasm::Type::Iterator::operator*((Iterator *)&builder);
      pTVar7 = wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      auVar6 = auStack_58;
      uVar5 = pTVar11->id;
      local_130._24_8_ = local_80.wasm;
      pEVar12 = (Expression *)MixedArena::allocSpace(&(local_80.wasm)->allocator,0x18,8);
      pEVar12->_id = LocalGetId;
      *(int *)(pEVar12 + 1) = (int)((ulong)((long)pTVar7 - (long)auVar6) >> 3);
      (pEVar12->type).id = uVar5;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                 local_130._32_8_,pEVar12);
      if (wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                  ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_58,
                   (iterator)
                   wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                   .super__Vector_impl_data._M_start,pTVar11);
      }
      else {
        (wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = pTVar11->id;
        wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      local_b8 = (string_view)Function::getLocalNameOrGeneric(local_c8,index);
      std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
      emplace_back<wasm::Name,wasm::Type_const&>
                ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)&ppNStack_a8,
                 (Name *)&local_b8,pTVar11);
      index = index + 1;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
              (Type *)local_130._40_8_) ||
            (BVar15.wasm = (Module *)local_130._24_8_, builder.wasm != (Module *)local_130));
  }
  this_01 = (Block *)MixedArena::allocSpace(&(BVar15.wasm)->allocator,0x40,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  (this_01->name).super_IString.str._M_len = 0;
  (this_01->name).super_IString.str._M_str = (char *)0x0;
  (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (this_01->list).allocator = &(BVar15.wasm)->allocator;
  uVar5 = *(uintptr_t *)local_130._64_8_;
  this_03 = &(local_80.wasm)->allocator;
  pEVar12 = (Expression *)MixedArena::allocSpace(this_03,0x18,8);
  pEVar12->_id = LocalGetId;
  *(undefined4 *)(pEVar12 + 1) = 0;
  (pEVar12->type).id = uVar5;
  this_02 = (GlobalSet *)MixedArena::allocSpace(this_03,0x28,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id = GlobalSetId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
  (this_02->name).super_IString.str._M_len = local_130._56_8_;
  (this_02->name).super_IString.str._M_str = (char *)local_130._48_8_;
  this_02->value = pEVar12;
  GlobalSet::finalize(this_02);
  this_04 = &this_01->list;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_04->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)this_02);
  pCVar9 = local_d8;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_04->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)local_d8);
  SVar19 = HeapType::getSignature(local_c0);
  this_00 = local_d0;
  TVar16 = SVar19.results.id;
  if (TVar16.id == 0) {
    pCVar9 = Builder::makeConst<int>(&local_80,0);
    TVar16.id = 2;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_04->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pCVar9);
  }
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pCVar9;
  Block::finalize(this_01,type_,Unknown);
  wasm::Type::Type((Type *)(local_130 + 0x10),(Tuple *)auStack_58);
  SVar19.results.id = TVar16.id;
  SVar19.params.id = local_130._16_8_;
  HeapType::HeapType((HeapType *)(local_130 + 8),SVar19);
  _builder = (string_view)ZEXT816(0);
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
  name.super_IString.str._M_str = (char *)local_130._72_8_;
  name.super_IString.str._M_len = (size_t)&local_b8;
  Builder::makeFunction
            (name,local_e0,(HeapType)&ppNStack_a8,
             (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_130._8_8_,
             (Expression *)&builder);
  if (builder.wasm != (Module *)0x0) {
    operator_delete(builder.wasm,
                    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index - (long)builder.wasm);
  }
  pFVar13 = Module::addFunction(this_00,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                         *)&local_b8);
  sVar18 = (pFVar13->super_Importable).super_Named.name.super_IString.str;
  if ((Function *)local_b8._M_len != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_b8,(Function *)local_b8._M_len);
  }
  if ((pointer)ppNStack_a8 != (pointer)0x0) {
    operator_delete(ppNStack_a8,
                    (long)namedWrapperParams.
                          super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppNStack_a8);
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return (IString)(IString)sVar18;
}

Assistant:

Name makeWrapperForExport(Function* func, Module* module, Name suspender) {
    Name wrapperName = Names::getValidFunctionName(
      *module, std::string("export$") + func->name.toString());

    Builder builder(*module);

    auto* call = module->allocator.alloc<Call>();
    call->target = func->name;
    call->type = func->getResults();

    // Add an externref param as the first argument and copy all the original
    // params to new export.
    std::vector<Type> wrapperParams;
    std::vector<NameType> namedWrapperParams;
    wrapperParams.push_back(externref);
    namedWrapperParams.emplace_back(Names::getValidLocalName(*func, "susp"),
                                    externref);
    Index i = 0;
    for (const auto& param : func->getParams()) {
      call->operands.push_back(
        builder.makeLocalGet(wrapperParams.size(), param));
      wrapperParams.push_back(param);
      namedWrapperParams.emplace_back(func->getLocalNameOrGeneric(i), param);
      i++;
    }
    auto* block = builder.makeBlock();
    block->list.push_back(
      builder.makeGlobalSet(suspender, builder.makeLocalGet(0, externref)));
    block->list.push_back(call);
    Type resultsType = func->getResults();
    if (resultsType == Type::none) {
      // A void return is not currently allowed by v8. Add an i32 return value
      // that is ignored.
      // https://bugs.chromium.org/p/v8/issues/detail?id=13231
      resultsType = Type::i32;
      block->list.push_back(builder.makeConst(0));
    }
    block->finalize();
    auto wrapperFunc =
      Builder::makeFunction(wrapperName,
                            std::move(namedWrapperParams),
                            Signature(Type(wrapperParams), resultsType),
                            {},
                            block);
    return module->addFunction(std::move(wrapperFunc))->name;
  }